

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  pointer pOVar16;
  ulong uVar17;
  float *pfVar18;
  vector<Object,_std::allocator<Object>_> *pvVar19;
  ulong uVar20;
  pointer pOVar21;
  ulong uVar22;
  long lVar23;
  int left;
  float fVar24;
  float fVar25;
  int top;
  __m128 t_2;
  undefined1 auVar26 [16];
  float fVar28;
  undefined1 auVar27 [16];
  __m128 t;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  allocator local_319;
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float mean_vals [3];
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  undefined1 local_258 [64];
  size_t local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Mat image;
  float local_1f0;
  float fStack_1ec;
  Allocator *local_1d8;
  Mat m;
  undefined8 local_190;
  uchar *local_188;
  Net nanodet;
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&nanodet,pcVar9,(allocator *)&image);
    cv::imread((string *)&m,(int)&nanodet);
    std::__cxx11::string::~string((string *)&nanodet);
    cVar12 = cv::Mat::empty();
    if (cVar12 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&nanodet);
      nanodet.opt.use_vulkan_compute = true;
      iVar13 = ncnn::Net::load_param(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.param");
      if ((iVar13 != 0) ||
         (iVar13 = ncnn::Net::load_model(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.bin"),
         iVar13 != 0)) {
        exit(-1);
      }
      local_208 = (float)local_190;
      fStack_204 = (float)((ulong)local_190 >> 0x20);
      fStack_200 = 0.0;
      fStack_1fc = 0.0;
      if ((int)local_208 < (int)fStack_204) {
        local_2b8._4_4_ = 416.0 / (float)(int)fStack_204;
        iVar14 = (int)((float)(int)local_208 * (float)local_2b8._4_4_);
        iVar13 = 0x1a0;
      }
      else {
        local_2b8._4_4_ = 416.0 / (float)(int)local_208;
        iVar13 = (int)((float)(int)fStack_204 * (float)local_2b8._4_4_);
        iVar14 = 0x1a0;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,2,(int)fStack_204,(int)local_208,iVar13,iVar14,
                 (Allocator *)0x0);
      local_218 = 0;
      local_258._0_4_ = 0;
      local_258._4_4_ = 0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._24_4_ = 0;
      local_258._32_8_ = (Allocator *)0x0;
      local_258._40_4_ = 0;
      local_258._44_4_ = 0;
      local_258._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar13 = ((iVar13 + 0x1f) / 0x20) * 0x20 - iVar13;
      iVar14 = ((iVar14 + 0x1f) / 0x20) * 0x20 - iVar14;
      left = iVar13 / 2;
      top = iVar14 / 2;
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_258,top,iVar14 - top,left,iVar13 - left,0,0.0,
                 (Option *)&areas);
      mean_vals[0] = 103.53;
      mean_vals[1] = 116.28;
      mean_vals[2] = 123.675;
      norm_vals[0] = 0.017429;
      norm_vals[1] = 0.017507;
      norm_vals[2] = 0.017125;
      ncnn::Mat::substract_mean_normalize((Mat *)local_258,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",(Mat *)local_258);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar19 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"231",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,8,(Mat *)&objects8,0.0,pvVar19);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar19 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"228",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x10,(Mat *)&objects8,0.0,pvVar19);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar19 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"225",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x20,(Mat *)&objects8,0.0,pvVar19);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar19 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"222",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x40,(Mat *)&objects8,0.0,pvVar19);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)(((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                               .super__Vector_impl_data._M_start) / 0x18) + -1);
        pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar17 = ((long)pOVar16 -
               (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar13 = (int)uVar17;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)iVar13,(allocator_type *)&baseLine);
      uVar20 = 0;
      uVar22 = 0;
      if (0 < iVar13) {
        uVar22 = uVar17 & 0xffffffff;
      }
      pfVar18 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start)->rect).height;
      for (; uVar22 != uVar20; uVar20 = uVar20 + 1) {
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] = pfVar18[-1] * *pfVar18;
        pfVar18 = pfVar18 + 6;
      }
      for (baseLine = 0; baseLine < iVar13; baseLine = baseLine + 1) {
        pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start + baseLine;
        uVar20 = (ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar17 = uVar20 & 0xffffffff;
        if ((int)uVar20 < 1) {
          uVar17 = 0;
        }
        uVar20 = 1;
        for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
          fVar15 = (&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start)->rect).x)[uVar22];
          if (pOVar16->label ==
              proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar15].label) {
            pOVar21 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + (int)fVar15;
            uVar3._0_4_ = (pOVar16->rect).x;
            uVar3._4_4_ = (pOVar16->rect).y;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar3;
            uVar1 = (pOVar16->rect).width;
            uVar7 = (pOVar16->rect).height;
            uVar4._0_4_ = (pOVar21->rect).x;
            uVar4._4_4_ = (pOVar21->rect).y;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar4;
            uVar2 = (pOVar21->rect).width;
            uVar8 = (pOVar21->rect).height;
            auVar26._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
            auVar26._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
            auVar26._8_8_ = 0;
            auVar32 = maxps(auVar31,auVar32);
            auVar30._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
            auVar30._4_4_ = (float)uVar7 + (float)uVar3._4_4_;
            auVar30._8_8_ = 0;
            auVar26 = minps(auVar26,auVar30);
            fVar24 = auVar26._0_4_ - auVar32._0_4_;
            fVar28 = auVar26._4_4_ - auVar32._4_4_;
            fVar25 = 0.0;
            if (0.0 < fVar28 && 0.0 < fVar24) {
              fVar25 = fVar24 * fVar28;
            }
            if (0.5 < fVar25 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[baseLine] +
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[(int)fVar15]) - fVar25)) {
              uVar20 = 0;
            }
          }
        }
        if ((int)uVar20 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&objects8,&baseLine);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&areas.super__Vector_base<float,_std::allocator<float>_>);
      uVar17 = (ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      iVar13 = (int)uVar17;
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)iVar13);
      iVar14 = (int)fStack_204 + -1;
      fStack_204 = (float)((int)local_208 + -1);
      local_208 = (float)iVar14;
      fStack_200 = (float)((int)fStack_200 + -1);
      fStack_1fc = (float)((int)fStack_1fc + -1);
      uVar20 = 0;
      uVar17 = uVar17 & 0xffffffff;
      if (iVar13 < 1) {
        uVar17 = uVar20;
      }
      local_2b8._0_4_ = local_2b8._4_4_;
      fStack_2b0 = (float)local_2b8._4_4_;
      fStack_2ac = (float)local_2b8._4_4_;
      lVar23 = 8;
      for (; uVar17 != uVar20; uVar20 = uVar20 + 1) {
        Object::operator=((Object *)
                          ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar23 + -8),
                          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (int)(&((objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->rect).x)[uVar20]);
        uVar5 = *(undefined8 *)
                 ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar23 + -8);
        uVar6 = *(undefined8 *)
                 ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x + lVar23);
        fVar15 = (float)uVar5;
        fVar24 = (float)((ulong)uVar5 >> 0x20);
        auVar27._0_4_ = fVar15 - (float)left;
        auVar27._4_4_ = fVar24 - (float)top;
        auVar27._8_8_ = 0;
        auVar26 = divps(auVar27,_local_2b8);
        auVar29._0_4_ = ((float)uVar6 + fVar15) - (float)left;
        auVar29._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar24) - (float)top;
        auVar29._8_8_ = 0;
        auVar32 = divps(auVar29,_local_2b8);
        auVar11._4_4_ = fStack_204;
        auVar11._0_4_ = local_208;
        auVar11._8_4_ = fStack_200;
        auVar11._12_4_ = fStack_1fc;
        auVar26 = minps(auVar11,auVar26);
        auVar26 = maxps(ZEXT816(0),auVar26);
        auVar32 = minps(auVar11,auVar32);
        auVar32 = maxps(ZEXT816(0),auVar32);
        *(long *)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar23 + -8) = auVar26._0_8_;
        *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start)->rect).x + lVar23) =
             CONCAT44(auVar32._4_4_ - auVar26._4_4_,auVar32._0_4_ - auVar26._0_4_);
        lVar23 = lVar23 + 0x18;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&objects8);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&proposals.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Extractor::~Extractor(&ex);
      piVar10 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258._4_4_,local_258._0_4_));
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(fStack_1ec,local_1f0);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&nanodet);
      cv::Mat::clone();
      lVar23 = 0;
      uVar17 = 0;
      while( true ) {
        pOVar16 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_258._8_8_ = &image;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar17) break;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->prob + lVar23)
                ,(double)*(float *)((long)&((objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                   lVar23),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar23),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar23),
                SUB84((double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar23),0),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar23)
               );
        local_258._16_4_ = 0;
        local_258._20_4_ = 0;
        local_258._0_4_ = 0x3010000;
        pfVar18 = (float *)((long)&(pOVar16->rect).x + lVar23);
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = (int)ROUND(pfVar18[1]);
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = (int)ROUND(*pfVar18);
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._0_4_ = (int)ROUND(pfVar18[2]);
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._4_4_ = (int)ROUND(pfVar18[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&nanodet);
        nanodet._vptr_Net = (_func_int **)0x406fe00000000000;
        nanodet.opt.lightmode = false;
        nanodet.opt._1_3_ = 0;
        nanodet.opt.num_threads = 0;
        nanodet.opt.blob_allocator = (Allocator *)0x0;
        nanodet.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle((string *)local_258,&objects8,&nanodet,1,8,0);
        sprintf((char *)&nanodet,"%s %.1f%%",
                (double)(*(float *)((long)&pOVar16->prob + lVar23) * 100.0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar16->label + lVar23) * 4));
        baseLine = 0;
        std::__cxx11::string::string((string *)local_258,(char *)&nanodet,(allocator *)&proposals);
        cv::getTextSize((string *)mean_vals,(int)(string *)local_258,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)local_258);
        fVar15 = (float)(int)*(float *)((long)&(pOVar16->rect).x + lVar23);
        iVar13 = (int)((*(float *)((long)&(pOVar16->rect).y + lVar23) - (float)(int)mean_vals[1]) -
                      (float)baseLine);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        fVar24 = (float)((int)fStack_1ec - (int)mean_vals[0]);
        if ((int)mean_vals[0] + (int)fVar15 <= (int)fStack_1ec) {
          fVar24 = fVar15;
        }
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x3010000;
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&image;
        ex.d._4_4_ = baseLine + (int)mean_vals[1];
        ex.d._0_4_ = mean_vals[0];
        ex._vptr_Extractor._0_4_ = fVar24;
        ex._vptr_Extractor._4_4_ = iVar13;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_258);
        local_258._0_4_ = 0;
        local_258._4_4_ = 0x406fe000;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0x406fe000;
        local_258._16_4_ = 0;
        local_258._20_4_ = 0x406fe000;
        local_258._24_4_ = 0;
        local_258._28_4_ = 0;
        cv::rectangle(&proposals,&ex,(string *)local_258,0xffffffffffffffff,8,0);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x3010000;
        std::__cxx11::string::string((string *)local_258,(char *)&nanodet,&local_319);
        norm_vals[1] = (float)(iVar13 + (int)mean_vals[1]);
        norm_vals[0] = fVar24;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        cv::putText(0x3fe0000000000000,&proposals,(string *)local_258,norm_vals,0,
                    (Matx<double,_4,_1> *)&areas,1,8,0);
        std::__cxx11::string::~string((string *)local_258);
        uVar17 = uVar17 + 1;
        lVar23 = lVar23 + 0x18;
      }
      std::__cxx11::string::string((string *)&nanodet,"image",(allocator *)&proposals);
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._0_4_ = 0x1010000;
      cv::imshow((string *)&nanodet,(_InputArray *)local_258);
      std::__cxx11::string::~string((string *)&nanodet);
      iVar13 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar13 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_nanodet(m, objects);

    draw_objects(m, objects);

    return 0;
}